

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-poll.c
# Opt level: O0

uv_os_sock_t create_bound_socket(sockaddr_in bind_addr)

{
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  undefined8 uStack_38;
  int yes;
  int64_t eval_b;
  int64_t eval_a;
  int r;
  uv_os_sock_t sock;
  sockaddr_in bind_addr_local;
  
  bind_addr_local._0_8_ = bind_addr.sin_zero;
  _r = bind_addr._0_8_;
  eval_a._4_4_ = socket(2,1,0);
  eval_b = (int64_t)eval_a._4_4_;
  uStack_38 = 0;
  if (eval_b < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-poll.c"
            ,0x70,"sock",">=","0",eval_b,">=",0);
    abort();
  }
  eval_a_1._4_4_ = 1;
  eval_a._0_4_ = setsockopt(eval_a._4_4_,1,2,(void *)((long)&eval_a_1 + 4),4);
  if ((long)(int)eval_a != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-poll.c"
            ,0x78,"r","==","0",(long)(int)eval_a,"==",0);
    abort();
  }
  eval_a._0_4_ = bind(eval_a._4_4_,(sockaddr *)&r,0x10);
  if ((long)(int)eval_a != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-poll.c"
            ,0x7d,"r","==","0",(long)(int)eval_a,"==",0);
    abort();
  }
  return eval_a._4_4_;
}

Assistant:

static uv_os_sock_t create_bound_socket (struct sockaddr_in bind_addr) {
  uv_os_sock_t sock;
  int r;

  sock = socket(AF_INET, SOCK_STREAM, IPPROTO_IP);
#ifdef _WIN32
  ASSERT_NE(sock, INVALID_SOCKET);
#else
  ASSERT_GE(sock, 0);
#endif

#ifndef _WIN32
  {
    /* Allow reuse of the port. */
    int yes = 1;
    r = setsockopt(sock, SOL_SOCKET, SO_REUSEADDR, &yes, sizeof yes);
    ASSERT_OK(r);
  }
#endif

  r = bind(sock, (const struct sockaddr*) &bind_addr, sizeof bind_addr);
  ASSERT_OK(r);

  return sock;
}